

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O3

void __thiscall
session::send_lambda::operator()
          (send_lambda *this,
          message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          *msg)

{
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *pmVar1;
  session *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  sp;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>
  local_d0;
  stable_async_base<boost::beast::detail::bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
  local_a8;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x90);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001dca68;
  pmVar1 = (message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
            *)(p_Var3 + 1);
  boost::beast::http::
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(pmVar1,msg);
  psVar2 = this->self_;
  (psVar2->res_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pmVar1;
  local_e0 = pmVar1;
  local_d8._M_pi = p_Var3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(psVar2->res_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_d8);
  pmVar1 = local_e0;
  psVar2 = this->self_;
  std::__shared_ptr<session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<session,void>
            ((__shared_ptr<session,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
             (__weak_ptr<session,_(__gnu_cxx::_Lock_policy)2> *)psVar2);
  local_d0.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<1UL,_bool>.t =
       boost::beast::http::
       message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
       ::need_eof(local_e0);
  local_d0.h_ = (offset_in_session_to_subr)on_write;
  local_d0._8_8_ = 0;
  local_d0.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f8;
  local_d0.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_f0;
  local_f8 = (element_type *)0x0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::http::detail::
  write_msg_op<boost::beast::detail::bind_front_wrapper<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>,boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::
  write_msg_op<boost::beast::detail::bind_front_wrapper<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>,boost::beast::http::message<false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>const&>
            ((write_msg_op<boost::beast::detail::bind_front_wrapper<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>,boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,false,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
              *)&local_a8,&local_d0,&psVar2->stream_,pmVar1);
  boost::beast::
  stable_async_base<boost::beast::detail::bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
  ::~stable_async_base(&local_a8);
  if (local_d0.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
      .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
      super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
               .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
               super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  return;
}

Assistant:

void
        operator()(http::message<isRequest, Body, Fields>&& msg) const
        {
            // The lifetime of the message has to extend
            // for the duration of the async operation so
            // we use a shared_ptr to manage it.
            auto sp = std::make_shared<
                http::message<isRequest, Body, Fields>>(std::move(msg));

            // Store a type-erased version of the shared
            // pointer in the class to keep it alive.
            self_.res_ = sp;

            // Write the response
            http::async_write(
                self_.stream_,
                *sp,
                beast::bind_front_handler(
                    &session::on_write,
                    self_.shared_from_this(),
                    sp->need_eof()));
        }